

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeSet * __thiscall icu_63::UnicodeSet::complement(UnicodeSet *this)

{
  int32_t iVar1;
  UChar32 *pUVar2;
  uint in_EAX;
  UChar32 *pUVar3;
  UErrorCode status;
  undefined8 uStack_18;
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    uStack_18 = (ulong)in_EAX;
    if (*this->list == 0) {
      ensureBufferCapacity(this,this->len + -1,(UErrorCode *)((long)&uStack_18 + 4));
      if (0 < uStack_18._4_4_) {
        return this;
      }
      memcpy(this->buffer,this->list + 1,(long)this->len * 4 - 4);
      this->len = this->len + -1;
      pUVar3 = this->buffer;
    }
    else {
      ensureBufferCapacity(this,this->len + 1,(UErrorCode *)((long)&uStack_18 + 4));
      if (0 < uStack_18._4_4_) {
        return this;
      }
      memcpy(this->buffer + 1,this->list,(long)this->len << 2);
      pUVar3 = this->buffer;
      *pUVar3 = 0;
      this->len = this->len + 1;
    }
    pUVar2 = this->list;
    this->list = pUVar3;
    this->buffer = pUVar2;
    iVar1 = this->capacity;
    this->capacity = this->bufferCapacity;
    this->bufferCapacity = iVar1;
    if (this->pat != (char16_t *)0x0) {
      uprv_free_63(this->pat);
      this->pat = (char16_t *)0x0;
      this->patLen = 0;
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complement(void) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    UErrorCode status = U_ZERO_ERROR;
    if (list[0] == UNICODESET_LOW) {
        ensureBufferCapacity(len-1, status);
        if (U_FAILURE(status)) {
            return *this;
        }
        uprv_memcpy(buffer, list + 1, (size_t)(len-1)*sizeof(UChar32));
        --len;
    } else {
        ensureBufferCapacity(len+1, status);
        if (U_FAILURE(status)) {
            return *this;
        }
        uprv_memcpy(buffer + 1, list, (size_t)len*sizeof(UChar32));
        buffer[0] = UNICODESET_LOW;
        ++len;
    }
    swapBuffers();
    releasePattern();
    return *this;
}